

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

iterator __thiscall
cs::tree_type<cs::token_base_*>::merge
          (tree_type<cs::token_base_*> *this,iterator it,tree_type<cs::token_base_*> *tree)

{
  tree_node *ptVar1;
  token_base *ptVar2;
  int iVar3;
  token_base **pptVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  error *this_00;
  allocator local_41;
  iterator it_local;
  string local_38;
  
  it_local = it;
  if (it.mData != (tree_node *)0x0) {
    ptVar1 = tree->mRoot;
    ptVar2 = ptVar1->data;
    pptVar4 = iterator::data(&it_local);
    *pptVar4 = ptVar2;
    destroy((it_local.mData)->left);
    destroy((it_local.mData)->right);
    iVar3 = copy((EVP_PKEY_CTX *)ptVar1->left,(EVP_PKEY_CTX *)it_local.mData);
    (it_local.mData)->left = (tree_node *)CONCAT44(extraout_var,iVar3);
    iVar3 = copy((EVP_PKEY_CTX *)ptVar1->right,(EVP_PKEY_CTX *)it_local.mData);
    (it_local.mData)->right = (tree_node *)CONCAT44(extraout_var_00,iVar3);
    return (iterator)it_local.mData;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"E000E",&local_41);
  cov::error::error(this_00,&local_38);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

iterator merge(iterator it, const tree_type<T> &tree)
		{
			if (!it.usable())
				throw cov::error("E000E");
			tree_node *root = tree.mRoot;
			it.data() = root->data;
			destroy(it.mData->left);
			destroy(it.mData->right);
			it.mData->left = copy(root->left, it.mData);
			it.mData->right = copy(root->right, it.mData);
			return it;
		}